

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void * __thiscall
Rml::Detail::BasicStackAllocator::allocate
          (BasicStackAllocator *this,size_t alignment,size_t byte_size)

{
  void *pvVar1;
  void *result;
  size_t available_space;
  size_t byte_size_local;
  size_t alignment_local;
  BasicStackAllocator *this_local;
  
  result = (void *)(this->N - ((long)this->p - (long)this->data));
  available_space = byte_size;
  byte_size_local = alignment;
  alignment_local = (size_t)this;
  pvVar1 = rmlui_align(alignment,byte_size,&this->p,(size_t *)&result);
  if (pvVar1 == (void *)0x0) {
    this_local = (BasicStackAllocator *)malloc(available_space);
  }
  else {
    this_local = (BasicStackAllocator *)this->p;
    this->p = (void *)((long)this->p + available_space);
  }
  return this_local;
}

Assistant:

void* BasicStackAllocator::allocate(size_t alignment, size_t byte_size)
	{
		size_t available_space = N - ((byte*)p - data);

		if (rmlui_align(alignment, byte_size, p, available_space))
		{
			void* result = p;
			p = (byte*)p + byte_size;
			return result;
		}

		// Fall back to malloc
		return malloc(byte_size);
	}